

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# system.c
# Opt level: O3

ecs_on_demand_in_t * get_in_component(ecs_map_t *component_map,ecs_entity_t component)

{
  ecs_on_demand_in_t *peVar1;
  ecs_on_demand_in_t in_value;
  undefined8 local_28;
  undefined8 uStack_20;
  
  peVar1 = (ecs_on_demand_in_t *)_ecs_map_get(component_map,0x10,component);
  if (peVar1 == (ecs_on_demand_in_t *)0x0) {
    local_28 = 0;
    uStack_20 = 0;
    _ecs_map_set(component_map,0x10,component,&local_28);
    peVar1 = (ecs_on_demand_in_t *)_ecs_map_get(component_map,0x10,component);
    _ecs_assert(peVar1 != (ecs_on_demand_in_t *)0x0,0xc,(char *)0x0,"in != NULL",
                "/workspace/llm4binary/github/license_all_cmakelists_25/duddel[P]flecs-lab/build_O3/flecs-clone-prefix/src/flecs-clone/src/modules/system/system.c"
                ,0x1e);
    if (peVar1 == (ecs_on_demand_in_t *)0x0) {
      __assert_fail("in != ((void*)0)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/duddel[P]flecs-lab/build_O3/flecs-clone-prefix/src/flecs-clone/src/modules/system/system.c"
                    ,0x1e,"ecs_on_demand_in_t *get_in_component(ecs_map_t *, ecs_entity_t)");
    }
  }
  return peVar1;
}

Assistant:

static
ecs_on_demand_in_t* get_in_component(
    ecs_map_t *component_map,
    ecs_entity_t component)
{
    ecs_on_demand_in_t *in = ecs_map_get(
        component_map, ecs_on_demand_in_t, component);
    if (!in) {
        ecs_on_demand_in_t in_value = {0};
        ecs_map_set(component_map, component, &in_value);
        in = ecs_map_get(component_map, ecs_on_demand_in_t, component);
        ecs_assert(in != NULL, ECS_INTERNAL_ERROR, NULL);
    }

    return in;
}